

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextimagehandler.cpp
# Opt level: O2

QUrl findAtNxFileOrResource
               (QString *baseFileName,qreal targetDevicePixelRatio,qreal *sourceDevicePixelRatio,
               QString *name)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  char cVar4;
  char cVar5;
  QString *in_RCX;
  long in_FS_OFFSET;
  QStringBuilder<QLatin1String,_QString_&> local_90;
  QArrayDataPointer<char16_t> local_78;
  QUrl url;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = 0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  url.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::QUrl(&url,(QString *)sourceDevicePixelRatio,TolerantMode);
  cVar4 = QUrl::isLocalFile();
  if (cVar4 == '\0') {
    cVar5 = QString::startsWith((QLatin1String *)sourceDevicePixelRatio,5);
    if (cVar5 == '\0') {
      QString::operator=((QString *)&local_58,(QString *)sourceDevicePixelRatio);
      cVar5 = QString::startsWith((QLatin1String *)sourceDevicePixelRatio,2);
    }
    else {
      QString::sliced((QString *)&local_78,(QString *)sourceDevicePixelRatio,3);
      qVar1 = local_58.size;
      pcVar3 = local_58.ptr;
      pDVar2 = local_58.d;
      local_58.d = local_78.d;
      local_58.ptr = local_78.ptr;
      local_78.d = pDVar2;
      local_78.ptr = pcVar3;
      local_58.size = local_78.size;
      local_78.size = qVar1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      cVar5 = '\x01';
    }
  }
  else {
    QUrl::toLocalFile();
    qVar1 = local_58.size;
    pcVar3 = local_58.ptr;
    pDVar2 = local_58.d;
    local_58.d = local_78.d;
    local_58.ptr = local_78.ptr;
    local_78.d = pDVar2;
    local_78.ptr = pcVar3;
    local_58.size = local_78.size;
    local_78.size = qVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    cVar5 = '\0';
  }
  qt_findAtNxFile((QString *)&local_78,(QString *)&local_58,targetDevicePixelRatio,(qreal *)name);
  pDVar2 = *(Data **)in_RCX;
  pcVar3 = *(char16_t **)(in_RCX + 8);
  *(Data **)in_RCX = local_78.d;
  *(char16_t **)(in_RCX + 8) = local_78.ptr;
  qVar1 = *(qsizetype *)(in_RCX + 0x10);
  *(qsizetype *)(in_RCX + 0x10) = local_78.size;
  local_78.d = pDVar2;
  local_78.ptr = pcVar3;
  local_78.size = qVar1;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  if (cVar4 == '\0') {
    if (cVar5 == '\0') {
      QUrl::QUrl((QUrl *)baseFileName,in_RCX,TolerantMode);
    }
    else {
      local_90.a.m_size = 3;
      local_90.a.m_data = "qrc";
      QStringBuilder<QLatin1String,_QString_&>::convertTo<QString>((QString *)&local_78,&local_90);
      QUrl::QUrl((QUrl *)baseFileName,(QString *)&local_78,TolerantMode);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    }
  }
  else {
    QUrl::fromLocalFile((QString *)baseFileName);
  }
  QUrl::~QUrl(&url);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QUrl)(QUrlPrivate *)baseFileName;
  }
  __stack_chk_fail();
}

Assistant:

static inline QUrl findAtNxFileOrResource(const QString &baseFileName,
                                          qreal targetDevicePixelRatio,
                                          qreal *sourceDevicePixelRatio,
                                          QString *name)
{
    // qt_findAtNxFile expects a file name that can be tested with QFile::exists.
    // so if the format.name() is a file:/ or qrc:/ URL, then we need to strip away the schema.
    QString localFile;
    const QUrl url(baseFileName);
    bool hasFileScheme = false;
    bool isResource = false;
    if (url.isLocalFile()) {
        localFile = url.toLocalFile();
        hasFileScheme = true;
    } else if (baseFileName.startsWith("qrc:/"_L1)) {
        // QFile::exists() can only handle ":/file.txt"
        localFile = baseFileName.sliced(3);
        isResource = true;
    } else {
        localFile = baseFileName;
        isResource = baseFileName.startsWith(":/"_L1);
    }
    *name = qt_findAtNxFile(localFile, targetDevicePixelRatio, sourceDevicePixelRatio);

    if (hasFileScheme)
        return QUrl::fromLocalFile(*name);
    if (isResource)
        return QUrl("qrc"_L1 + *name);
    return QUrl(*name);
}